

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O2

SRes crnlib::LzmaDec_Allocate(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  SRes SVar1;
  Byte *pBVar2;
  ulong uVar3;
  CLzmaProps propNew;
  
  SVar1 = LzmaProps_Decode(&propNew,props,propsSize);
  if ((SVar1 == 0) && (SVar1 = LzmaDec_AllocateProbs2(p,&propNew,alloc), SVar1 == 0)) {
    uVar3 = (ulong)propNew.dicSize;
    if ((p->dic == (Byte *)0x0) || (p->dicBufSize != uVar3)) {
      (*alloc->Free)(alloc,p->dic);
      p->dic = (Byte *)0x0;
      pBVar2 = (Byte *)(*alloc->Alloc)(alloc,uVar3);
      p->dic = pBVar2;
      if (pBVar2 == (Byte *)0x0) {
        (*alloc->Free)(alloc,p->probs);
        p->probs = (UInt16 *)0x0;
        return 2;
      }
    }
    p->dicBufSize = uVar3;
    (p->prop).lc = propNew.lc;
    (p->prop).lp = propNew.lp;
    (p->prop).pb = propNew.pb;
    (p->prop).dicSize = propNew.dicSize;
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SRes LzmaDec_Allocate(CLzmaDec* p, const Byte* props, unsigned propsSize, ISzAlloc* alloc) {
  CLzmaProps propNew;
  SizeT dicBufSize;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  dicBufSize = propNew.dicSize;
  if (p->dic == 0 || dicBufSize != p->dicBufSize) {
    LzmaDec_FreeDict(p, alloc);
    p->dic = (Byte*)alloc->Alloc(alloc, dicBufSize);
    if (p->dic == 0) {
      LzmaDec_FreeProbs(p, alloc);
      return SZ_ERROR_MEM;
    }
  }
  p->dicBufSize = dicBufSize;
  p->prop = propNew;
  return SZ_OK;
}